

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<deqp::egl::(anonymous_namespace)::Program> * __thiscall
de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>::operator=
          (SharedPtr<deqp::egl::(anonymous_namespace)::Program> *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::Program> *other)

{
  SharedPtr<deqp::egl::(anonymous_namespace)::Program> *other_local;
  SharedPtr<deqp::egl::(anonymous_namespace)::Program> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}